

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.c
# Opt level: O0

char * duckdb_shell_sqlite3_snprintf(int n,char *zBuf,char *zFormat,...)

{
  char in_AL;
  char *pcVar1;
  __va_list_tag *in_RCX;
  char *in_R8;
  char *in_R9;
  undefined8 in_XMM0_Qa;
  va_list ap;
  char *z;
  undefined8 in_stack_ffffffffffffff48;
  int n_00;
  
  n_00 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  if (in_AL != '\0') {
    n_00 = (int)((ulong)in_XMM0_Qa >> 0x20);
  }
  pcVar1 = duckdb_shell_sqlite3_vsnprintf(n_00,in_R9,in_R8,in_RCX);
  return pcVar1;
}

Assistant:

char *sqlite3_snprintf(int n, char *zBuf, const char *zFormat, ...) {
	char *z;
	va_list ap;
	va_start(ap, zFormat);
	z = sqlite3_vsnprintf(n, zBuf, zFormat, ap);
	va_end(ap);
	return z;
}